

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

DateFormat * __thiscall icu_63::DateFormat::operator=(DateFormat *this,DateFormat *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DateFormat *other_local;
  DateFormat *this_local;
  
  if (this != other) {
    if (this->fCalendar != (Calendar *)0x0) {
      (*(this->fCalendar->super_UObject)._vptr_UObject[1])();
    }
    if (this->fNumberFormat != (NumberFormat *)0x0) {
      (*(this->fNumberFormat->super_Format).super_UObject._vptr_UObject[1])();
    }
    if (other->fCalendar == (Calendar *)0x0) {
      this->fCalendar = (Calendar *)0x0;
    }
    else {
      iVar1 = (*(other->fCalendar->super_UObject)._vptr_UObject[3])();
      this->fCalendar = (Calendar *)CONCAT44(extraout_var,iVar1);
    }
    if (other->fNumberFormat == (NumberFormat *)0x0) {
      this->fNumberFormat = (NumberFormat *)0x0;
    }
    else {
      iVar1 = (*(other->fNumberFormat->super_Format).super_UObject._vptr_UObject[4])();
      this->fNumberFormat = (NumberFormat *)CONCAT44(extraout_var_00,iVar1);
    }
    EnumSet<UDateFormatBooleanAttribute,_0U,_4U>::operator=(&this->fBoolFlags,&other->fBoolFlags);
    this->fCapitalizationContext = other->fCapitalizationContext;
  }
  return this;
}

Assistant:

DateFormat& DateFormat::operator=(const DateFormat& other)
{
    if (this != &other)
    {
        delete fCalendar;
        delete fNumberFormat;
        if(other.fCalendar) {
          fCalendar = other.fCalendar->clone();
        } else {
          fCalendar = NULL;
        }
        if(other.fNumberFormat) {
          fNumberFormat = (NumberFormat*)other.fNumberFormat->clone();
        } else {
          fNumberFormat = NULL;
        }
        fBoolFlags = other.fBoolFlags;
        fCapitalizationContext = other.fCapitalizationContext;
    }
    return *this;
}